

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::prepareChildren(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                  *this,Node *n,bool backtrackable)

{
  int iVar1;
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> local_48;
  
  iVar1 = (*n->_vptr_Node[2])(n);
  if ((char)iVar1 == '\0') {
    Lib::Stack<unsigned_int>::push(&this->_svStack,*(uint *)&n[1]._vptr_Node);
    local_48._isSome = false;
    local_48._1_7_ = 0;
    local_48._elem._elem = (Value)0x0;
    Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::operator=
              (&(this->_leafData).
                super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
               ,&local_48);
    Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::
    ~OptionBase(&local_48);
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::
    selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Lhs>
              ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)
               &stack0xffffffffffffffc8,(IntermediateNode *)this);
    Lib::
    Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>
    ::push(&this->_nodeIterators,
           (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
            *)&stack0xffffffffffffffc8);
    Lib::
    VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
    ::~VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
                        *)&stack0xffffffffffffffc8);
    if (backtrackable) {
      Lib::BacktrackData::
      addClosure<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::prepareChildren(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node*,bool)::_lambda()_1_>
                ((this->_bdStack)._cursor + -1,(anon_class_8_1_8991fb9c_for__fun)this);
    }
  }
  else {
    (*n->_vptr_Node[8])((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)
                        &stack0xffffffffffffffd0,n);
    Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::
    OptionBase(&local_48,
               (VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)
               &stack0xffffffffffffffd0);
    Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::operator=
              (&(this->_leafData).
                super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
               ,&local_48);
    Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::
    ~OptionBase(&local_48);
    Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::~VirtualIterator
              ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)
               &stack0xffffffffffffffd0);
  }
  return;
}

Assistant:

void prepareChildren(Node* n, bool backtrackable) {
        if(n->isLeaf()) {
          _leafData = some(static_cast<Leaf*>(n)->allChildren());
        } else {
          IntermediateNode* inode=static_cast<IntermediateNode*>(n);
          _svStack.push(inode->childVar);
          _leafData = {};
          DEBUG_QUERY(1, "entering node: S", _svStack.top())
          
          _nodeIterators.push(_algo.template selectPotentiallyUnifiableChildren<LeafData>(inode));
          if (backtrackable) {
            _bdStack.top().addClosure([&]() { 
                DEBUG_CODE(auto var = )_svStack.pop();
                DEBUG_QUERY(1, "backtracking node: S", var)
                _nodeIterators.pop(); 
            });
          }
        }
      }